

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

void __thiscall comp_options::print(comp_options *this)

{
  uint *in_RDI;
  
  printf("Comp level: %u\n",(ulong)*in_RDI);
  printf("Dict size: %i (%u bytes)\n",(ulong)in_RDI[1],(ulong)(uint)(1 << ((byte)in_RDI[1] & 0x1f)))
  ;
  printf("Compute adler32 during decompression: %u\n",(ulong)((byte)in_RDI[2] & 1));
  printf("Max helper threads: %i\n",(ulong)in_RDI[3]);
  printf("Unbuffered decompression: %u\n",(ulong)((byte)in_RDI[4] & 1));
  printf("Verify compressed data: %u\n",(ulong)(*(byte *)((long)in_RDI + 0x11) & 1));
  printf("Extreme parsing: %u\n",(ulong)(*(byte *)((long)in_RDI + 0x13) & 1));
  printf("Randomize parameters: %u\n",(ulong)(*(byte *)((long)in_RDI + 0x12) & 1));
  printf("Deterministic parsing: %u\n",(ulong)((byte)in_RDI[5] & 1));
  printf("Trade off decompression rate for compression ratio: %u\n",
         (ulong)(*(byte *)((long)in_RDI + 0x15) & 1));
  printf("Test compressor reinit: %u\n",(ulong)(*(byte *)((long)in_RDI + 0x16) & 1));
  printf("Table update speed: %u\n",(ulong)in_RDI[6]);
  printf("Max best arrivals: %u\n",(ulong)in_RDI[7]);
  printf("Force single threaded parsing: %u\n",(ulong)((byte)in_RDI[8] & 1));
  printf("Use low memory match finder: %u\n",(ulong)(*(byte *)((long)in_RDI + 0x21) & 1));
  printf("Parsing fast bytes: %u\n",(ulong)in_RDI[9]);
  return;
}

Assistant:

void print()
   {
      printf("Comp level: %u\n", m_comp_level);
      printf("Dict size: %i (%u bytes)\n", m_dict_size_log2, 1 << m_dict_size_log2);
      printf("Compute adler32 during decompression: %u\n", (uint)m_compute_adler32_during_decomp);
      printf("Max helper threads: %i\n", m_max_helper_threads);
      printf("Unbuffered decompression: %u\n", (uint)m_unbuffered_decompression);
      printf("Verify compressed data: %u\n", (uint)m_verify_compressed_data);
      printf("Extreme parsing: %u\n", (uint)m_extreme_parsing);
      printf("Randomize parameters: %u\n", m_randomize_params);
      printf("Deterministic parsing: %u\n", m_deterministic_parsing);
      printf("Trade off decompression rate for compression ratio: %u\n", m_tradeoff_decomp_rate_for_comp_ratio);
      printf("Test compressor reinit: %u\n", m_test_compressor_reinit);
		printf("Table update speed: %u\n", m_table_update_rate);
      printf("Max best arrivals: %u\n", m_max_best_arrivals);
      printf("Force single threaded parsing: %u\n", m_force_single_threaded_parsing);
      printf("Use low memory match finder: %u\n", m_low_memory_finder);
      printf("Parsing fast bytes: %u\n", m_fast_bytes);
   }